

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O0

shared_ptr<Form> __thiscall
LinkedObjectFile::to_form_script
          (LinkedObjectFile *this,int seg,int word_idx,vector<bool,_std::allocator<bool>_> *seen)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  int in_ECX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  reference rVar5;
  shared_ptr<Form> sVar6;
  vector<bool,_std::allocator<bool>_> *in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000034;
  LinkedObjectFile *in_stack_00000038;
  value_type *cdr_word;
  int cdr_addr;
  shared_ptr<Form> fill;
  int goal_print_obj;
  shared_ptr<Form> *result;
  SymbolTable *in_stack_fffffffffffffef8;
  reference in_stack_ffffffffffffff00;
  reference in_stack_ffffffffffffff08;
  LinkedObjectFile *in_stack_ffffffffffffff10;
  reference local_68 [4];
  byte local_25;
  uint local_24;
  
  local_24 = in_ECX * 4 + 2;
  local_25 = 0;
  std::make_shared<Form>();
  peVar3 = std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1ad3b2);
  peVar3->kind = PAIR;
  std::shared_ptr<Form>::shared_ptr
            ((shared_ptr<Form> *)in_stack_ffffffffffffff00,
             (shared_ptr<Form> *)in_stack_fffffffffffffef8);
  while( true ) {
    if ((local_24 & 7) != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x2e3,
                    "std::shared_ptr<Form> LinkedObjectFile::to_form_script(int, int, std::vector<bool> &)"
                   );
    }
    to_form_script_object(in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_00000028);
    std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad417);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_stack_ffffffffffffff00,
               (shared_ptr<Form> *)in_stack_fffffffffffffef8);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad43a);
    rVar5 = std::vector<bool,_std::allocator<bool>_>::at
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff00,
                       (size_type)in_stack_fffffffffffffef8);
    local_68[0] = rVar5;
    std::_Bit_reference::operator=(local_68,true);
    iVar2 = local_24 + 2;
    bVar1 = is_empty_list(in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                          (int)in_stack_ffffffffffffff08);
    if (bVar1) {
      SymbolTable::getEmptyPair(in_stack_fffffffffffffef8);
      std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad4f5);
      std::shared_ptr<Form>::operator=
                ((shared_ptr<Form> *)in_stack_ffffffffffffff00,
                 (shared_ptr<Form> *)in_stack_fffffffffffffef8);
      std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad51a);
      goto LAB_001ad769;
    }
    if (iVar2 % 4 != 0) {
      __assert_fail("(cdr_addr % 4) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                    ,0x2d2,
                    "std::shared_ptr<Form> LinkedObjectFile::to_form_script(int, int, std::vector<bool> &)"
                   );
    }
    in_stack_ffffffffffffff10 =
         (LinkedObjectFile *)
         std::
         vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
         ::at((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
               *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
    in_stack_ffffffffffffff08 =
         std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at
                   ((vector<LinkedWord,_std::allocator<LinkedWord>_> *)in_stack_ffffffffffffff00,
                    (size_type)in_stack_fffffffffffffef8);
    if (in_stack_ffffffffffffff08->kind != PTR) break;
    in_stack_ffffffffffffff00 =
         std::vector<Label,_std::allocator<Label>_>::at
                   ((vector<Label,_std::allocator<Label>_> *)in_stack_ffffffffffffff00,
                    (size_type)in_stack_fffffffffffffef8);
    if ((in_stack_ffffffffffffff00->offset & 7U) != 2) break;
    in_stack_fffffffffffffef8 =
         (SymbolTable *)
         std::vector<Label,_std::allocator<Label>_>::at
                   ((vector<Label,_std::allocator<Label>_> *)in_stack_ffffffffffffff00,
                    (size_type)in_stack_fffffffffffffef8);
    local_24 = *(uint *)&(in_stack_fffffffffffffef8->map)._M_h._M_rehash_policy.field_0x4;
    std::make_shared<Form>();
    std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad670);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_stack_ffffffffffffff00,
               (shared_ptr<Form> *)in_stack_fffffffffffffef8);
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad68f);
    std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad69c);
    peVar3 = std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1ad6ac);
    peVar3->kind = PAIR;
    std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad6bf);
    std::shared_ptr<Form>::operator=
              ((shared_ptr<Form> *)in_stack_ffffffffffffff00,
               (shared_ptr<Form> *)in_stack_fffffffffffffef8);
  }
  to_form_script_object(in_stack_00000038,in_stack_00000034,in_stack_00000030,in_stack_00000028);
  std::__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Form,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1ad70d);
  std::shared_ptr<Form>::operator=
            ((shared_ptr<Form> *)in_stack_ffffffffffffff00,
             (shared_ptr<Form> *)in_stack_fffffffffffffef8);
  std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad72c);
LAB_001ad769:
  local_25 = 1;
  std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad776);
  _Var4._M_pi = extraout_RDX;
  if ((local_25 & 1) == 0) {
    std::shared_ptr<Form>::~shared_ptr((shared_ptr<Form> *)0x1ad78a);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar6.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Form>)sVar6.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> LinkedObjectFile::to_form_script(int seg,
                                                       int word_idx,
                                                       std::vector<bool>& seen) {
  // the object to currently print. to start off, create pair from the car address we've been given.
  int goal_print_obj = word_idx * 4 + 2;

  // resulting form. we can't have a totally empty list (as an empty list looks like a symbol,
  // so it wouldn't be flagged), so it's safe to make this a pair.
  auto result = std::make_shared<Form>();
  result->kind = FormKind::PAIR;

  // the current pair to fill out.
  auto fill = result;

  // loop until we run out of things to add
  for (;;) {
    // check the thing to print is a a pair.
    if ((goal_print_obj & 7) == 2) {
      // first convert the car (again, with (&-> obj car))
      fill->pair[0] = to_form_script_object(seg, goal_print_obj - 2, seen);
      seen.at(goal_print_obj / 4) = true;

      auto cdr_addr = goal_print_obj + 2;

      if (is_empty_list(seg, cdr_addr)) {
        // the list has ended!
        fill->pair[1] = gSymbolTable.getEmptyPair();
        return result;
      } else {
        // cdr object should be aligned.
        assert((cdr_addr % 4) == 0);
        auto& cdr_word = words_by_seg.at(seg).at(cdr_addr / 4);
        // check for proper list
        if (cdr_word.kind == LinkedWord::PTR && (labels.at(cdr_word.label_id).offset & 7) == 2) {
          // yes, proper list. add another pair and link it in to the list.
          goal_print_obj = labels.at(cdr_word.label_id).offset;
          fill->pair[1] = std::make_shared<Form>();
          fill->pair[1]->kind = FormKind::PAIR;
          fill = fill->pair[1];
        } else {
          // improper list, put the last thing in and end
          fill->pair[1] = to_form_script_object(seg, cdr_addr, seen);
          return result;
        }
      }
    } else {
      // improper list, should be impossible to get here because of earlier checks
      assert(false);
    }
  }

  return result;
}